

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNodeChain<QDomNodePrivate_*>::free
          (MultiNodeChain<QDomNodePrivate_*> *this,void *__ptr)

{
  MultiNodeChain<QDomNodePrivate_*> *pMVar1;
  MultiNodeChain<QDomNodePrivate_*> *n;
  MultiNodeChain<QDomNodePrivate_*> *e;
  qsizetype nEntries;
  MultiNodeChain<QDomNodePrivate_*> *local_18;
  
  pMVar1 = this;
  while (local_18 = pMVar1, local_18 != (MultiNodeChain<QDomNodePrivate_*> *)0x0) {
    pMVar1 = local_18->next;
    if (local_18 != (MultiNodeChain<QDomNodePrivate_*> *)0x0) {
      ~MultiNodeChain(local_18);
      operator_delete(local_18,0x10);
    }
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }